

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterset.cpp
# Opt level: O3

void __thiscall ParameterSet::addParameter(ParameterSet *this,string *_name,bool _defaultValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined7 in_register_00000011;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_60;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,_defaultValue);
  paVar1 = &local_60.first.field_2;
  pcVar2 = (_name->_M_dataplus)._M_p;
  local_60.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + _name->_M_string_length);
  local_60.second = false;
  local_60._33_3_ = 0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Type>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
              *)&this->type_dict,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  pcVar2 = (_name->_M_dataplus)._M_p;
  local_60.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + _name->_M_string_length);
  local_60.second = SUB41(local_34,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,bool>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
              *)&this->bool_dict,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ParameterSet::addParameter(const string &_name, bool _defaultValue)
{
    type_dict.insert(std::make_pair(_name, BOOL));
    bool_dict.insert(std::make_pair(_name, _defaultValue));
}